

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

trt_type trop_resolve_type(lysp_node *pn)

{
  trt_type tVar1;
  char *tmp;
  lysp_node *pn_local;
  char *local_10;
  
  if (pn == (lysp_node *)0x0) {
    pn_local._0_4_ = 3;
    local_10 = (char *)0x0;
  }
  else {
    local_10 = trop_node_charptr(8,trop_leaflist_refpath,pn);
    if (local_10 == (char *)0x0) {
      local_10 = trop_node_charptr(8,trop_leaflist_type_name,pn);
      if (local_10 == (char *)0x0) {
        local_10 = trop_node_charptr(4,trop_leaf_refpath,pn);
        if (local_10 == (char *)0x0) {
          local_10 = trop_node_charptr(4,trop_leaf_type_name,pn);
          if (local_10 == (char *)0x0) {
            if (pn->nodetype == 0x60) {
              pn_local._0_4_ = 0;
              local_10 = "anydata";
            }
            else if ((pn->nodetype & 0x20) == 0) {
              pn_local._0_4_ = 3;
              local_10 = (char *)0x0;
            }
            else {
              pn_local._0_4_ = 0;
              local_10 = "anyxml";
            }
          }
          else {
            pn_local._0_4_ = 0;
          }
        }
        else {
          pn_local._0_4_ = 1;
        }
      }
      else {
        pn_local._0_4_ = 0;
      }
    }
    else {
      pn_local._0_4_ = 1;
    }
  }
  tVar1._4_4_ = 0;
  tVar1.type = (uint)pn_local;
  tVar1.str = local_10;
  return tVar1;
}

Assistant:

static struct trt_type
trop_resolve_type(const struct lysp_node *pn)
{
    const char *tmp = NULL;

    if (!pn) {
        return TRP_EMPTY_TRT_TYPE;
    } else if ((tmp = trop_node_charptr(LYS_LEAFLIST, trop_leaflist_refpath, pn))) {
        return TRP_INIT_TRT_TYPE(TRD_TYPE_TARGET, tmp);
    } else if ((tmp = trop_node_charptr(LYS_LEAFLIST, trop_leaflist_type_name, pn))) {
        return TRP_INIT_TRT_TYPE(TRD_TYPE_NAME, tmp);
    } else if ((tmp = trop_node_charptr(LYS_LEAF, trop_leaf_refpath, pn))) {
        return TRP_INIT_TRT_TYPE(TRD_TYPE_TARGET, tmp);
    } else if ((tmp = trop_node_charptr(LYS_LEAF, trop_leaf_type_name, pn))) {
        return TRP_INIT_TRT_TYPE(TRD_TYPE_NAME, tmp);
    } else if (pn->nodetype == LYS_ANYDATA) {
        return TRP_INIT_TRT_TYPE(TRD_TYPE_NAME, "anydata");
    } else if (pn->nodetype & LYS_ANYXML) {
        return TRP_INIT_TRT_TYPE(TRD_TYPE_NAME, "anyxml");
    } else {
        return TRP_EMPTY_TRT_TYPE;
    }
}